

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O2

matrix4d * tinyusdz::inverse(matrix4d *__return_storage_ptr__,matrix4d *_m)

{
  long lVar1;
  long lVar2;
  mat<double,_4,_4> *in_RDX;
  matrix44d *pmVar3;
  linalg *plVar4;
  matrix4d *pmVar5;
  byte bVar6;
  matrix44d inv_m;
  linalg local_98 [128];
  
  bVar6 = 0;
  lVar2 = 0x10;
  plVar4 = local_98;
  for (lVar1 = lVar2; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(double *)plVar4 = *(double *)_m;
    _m = (matrix4d *)((long)_m + 8);
    plVar4 = plVar4 + 8;
  }
  linalg::inverse<double,4>(&inv_m,local_98,in_RDX);
  pmVar3 = &inv_m;
  pmVar5 = __return_storage_ptr__;
  for (; lVar2 != 0; lVar2 = lVar2 + -1) {
    pmVar5->m[0][0] = *(double *)pmVar3;
    pmVar3 = (matrix44d *)((long)pmVar3 + ((ulong)bVar6 * -2 + 1) * 8);
    pmVar5 = (matrix4d *)((long)pmVar5 + ((ulong)bVar6 * -2 + 1) * 8);
  }
  return __return_storage_ptr__;
}

Assistant:

value::matrix4d inverse(const value::matrix4d &_m) {
  matrix44d m;
  // memory layout is same
  memcpy(&m[0][0], _m.m, sizeof(double) * 4 * 4);

  matrix44d inv_m = linalg::inverse(m);

  value::matrix4d outm;

  memcpy(outm.m, &inv_m[0][0], sizeof(double) * 4 * 4);

  return outm;
}